

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::XmlUnitTestResultPrinter::EscapeXml
                   (string *__return_storage_ptr__,string *str,bool is_attribute)

{
  ostream *poVar1;
  byte bVar2;
  uchar value;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  
  Message::Message((Message *)&local_58);
  poVar1 = (ostream *)(local_58._M_head_impl + 0x10);
  uVar4 = 0;
  do {
    if (str->_M_string_length <= uVar4) {
      StringStreamToString(__return_storage_ptr__,local_58._M_head_impl);
      if (local_58._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))(local_58._M_head_impl);
      }
      return __return_storage_ptr__;
    }
    bVar2 = (str->_M_dataplus)._M_p[uVar4];
    if (bVar2 == 0x22) {
      pcVar3 = "&quot;";
      if (!is_attribute) {
        std::operator<<(poVar1,'\"');
        goto LAB_002da89e;
      }
LAB_002da896:
      std::operator<<(poVar1,pcVar3);
    }
    else {
      if (bVar2 == 0x26) {
        pcVar3 = "&amp;";
        goto LAB_002da896;
      }
      if (bVar2 != 0x27) {
        pcVar3 = "&gt;";
        if (bVar2 != 0x3e) {
          if (bVar2 != 0x3c) {
            uVar5 = (uint)bVar2;
            if (('\x1f' < (char)bVar2) || ((bVar2 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0))))
            {
              if ((is_attribute) && ((uVar5 < 0xe && ((0x2600U >> (uVar5 & 0x1f) & 1) != 0)))) {
                std::operator<<(poVar1,"&#x");
                String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)uVar5,value);
                std::operator<<(poVar1,(string *)&local_50);
                std::operator<<(poVar1,";");
                std::__cxx11::string::~string((string *)&local_50);
              }
              else {
                std::operator<<(poVar1,bVar2);
              }
            }
            goto LAB_002da89e;
          }
          pcVar3 = "&lt;";
        }
        goto LAB_002da896;
      }
      pcVar3 = "&apos;";
      if (is_attribute) goto LAB_002da896;
      std::operator<<(poVar1,'\'');
    }
LAB_002da89e:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

std::string XmlUnitTestResultPrinter::EscapeXml(
    const std::string& str, bool is_attribute) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '<':
        m << "&lt;";
        break;
      case '>':
        m << "&gt;";
        break;
      case '&':
        m << "&amp;";
        break;
      case '\'':
        if (is_attribute)
          m << "&apos;";
        else
          m << '\'';
        break;
      case '"':
        if (is_attribute)
          m << "&quot;";
        else
          m << '"';
        break;
      default:
        if (IsValidXmlCharacter(ch)) {
          if (is_attribute && IsNormalizableWhitespace(ch))
            m << "&#x" << String::FormatByte(static_cast<unsigned char>(ch))
              << ";";
          else
            m << ch;
        }
        break;
    }
  }

  return m.GetString();
}